

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::capitalized_type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  char *__s;
  LogMessageFatal aLStack_18 [16];
  
  switch(this->descriptor_[2]) {
  case (FieldDescriptor)0x1:
    __s = "Double";
    break;
  case (FieldDescriptor)0x2:
    __s = "Float";
    break;
  case (FieldDescriptor)0x3:
    __s = "Int64";
    break;
  case (FieldDescriptor)0x4:
    __s = "UInt64";
    break;
  case (FieldDescriptor)0x5:
    __s = "Int32";
    break;
  case (FieldDescriptor)0x6:
    __s = "Fixed64";
    break;
  case (FieldDescriptor)0x7:
    __s = "Fixed32";
    break;
  case (FieldDescriptor)0x8:
    __s = "Bool";
    break;
  case (FieldDescriptor)0x9:
    __s = "String";
    break;
  case (FieldDescriptor)0xa:
    __s = "Group";
    break;
  case (FieldDescriptor)0xb:
    __s = "Message";
    break;
  case (FieldDescriptor)0xc:
    __s = "Bytes";
    break;
  case (FieldDescriptor)0xd:
    __s = "UInt32";
    break;
  case (FieldDescriptor)0xe:
    __s = "Enum";
    break;
  case (FieldDescriptor)0xf:
    __s = "SFixed32";
    break;
  case (FieldDescriptor)0x10:
    __s = "SFixed64";
    break;
  case (FieldDescriptor)0x11:
    __s = "SInt32";
    break;
  case (FieldDescriptor)0x12:
    __s = "SInt64";
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x1c5);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)aLStack_18,(char (*) [20])"Unknown field type.");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)aLStack_18);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::capitalized_type_name() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return "";
  }
}